

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGDumpDefine(FILE *output,xmlRelaxNGDefinePtr_conflict define)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlRelaxNGDefinePtr_conflict define_local;
  FILE *output_local;
  
  if (define != (xmlRelaxNGDefinePtr_conflict)0x0) {
    switch(define->type) {
    case XML_RELAXNG_EMPTY:
      fprintf((FILE *)output,"<empty/>\n");
      break;
    case XML_RELAXNG_NOT_ALLOWED:
      fprintf((FILE *)output,"<notAllowed/>\n");
      break;
    case XML_RELAXNG_EXCEPT:
    case XML_RELAXNG_PARAM:
    case XML_RELAXNG_START:
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c"
                ,0x1ea5);
      break;
    case XML_RELAXNG_TEXT:
      fprintf((FILE *)output,"<text/>\n");
      break;
    case XML_RELAXNG_ELEMENT:
      fprintf((FILE *)output,"<element>\n");
      if (define->name != (xmlChar *)0x0) {
        fprintf((FILE *)output,"<name");
        if (define->ns != (xmlChar *)0x0) {
          fprintf((FILE *)output," ns=\"%s\"",define->ns);
        }
        fprintf((FILE *)output,">%s</name>\n",define->name);
      }
      xmlRelaxNGDumpDefines(output,define->attrs);
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</element>\n");
      break;
    case XML_RELAXNG_DATATYPE:
    case XML_RELAXNG_VALUE:
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/relaxng.c"
                ,0x1ea1);
      break;
    case XML_RELAXNG_LIST:
      fprintf((FILE *)output,"<list>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</list>\n");
      break;
    case XML_RELAXNG_ATTRIBUTE:
      fprintf((FILE *)output,"<attribute>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</attribute>\n");
      break;
    case XML_RELAXNG_DEF:
      fprintf((FILE *)output,"<define");
      if (define->name != (xmlChar *)0x0) {
        fprintf((FILE *)output," name=\"%s\"",define->name);
      }
      fprintf((FILE *)output,">\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</define>\n");
      break;
    case XML_RELAXNG_REF:
      fprintf((FILE *)output,"<ref");
      if (define->name != (xmlChar *)0x0) {
        fprintf((FILE *)output," name=\"%s\"",define->name);
      }
      fprintf((FILE *)output,">\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</ref>\n");
      break;
    case XML_RELAXNG_EXTERNALREF:
      fprintf((FILE *)output,"<externalRef>");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</externalRef>\n");
      break;
    case XML_RELAXNG_PARENTREF:
      fprintf((FILE *)output,"<parentRef");
      if (define->name != (xmlChar *)0x0) {
        fprintf((FILE *)output," name=\"%s\"",define->name);
      }
      fprintf((FILE *)output,">\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</parentRef>\n");
      break;
    case XML_RELAXNG_OPTIONAL:
      fprintf((FILE *)output,"<optional>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</optional>\n");
      break;
    case XML_RELAXNG_ZEROORMORE:
      fprintf((FILE *)output,"<zeroOrMore>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</zeroOrMore>\n");
      break;
    case XML_RELAXNG_ONEORMORE:
      fprintf((FILE *)output,"<oneOrMore>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</oneOrMore>\n");
      break;
    case XML_RELAXNG_CHOICE:
      fprintf((FILE *)output,"<choice>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</choice>\n");
      break;
    case XML_RELAXNG_GROUP:
      fprintf((FILE *)output,"<group>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</group>\n");
      break;
    case XML_RELAXNG_INTERLEAVE:
      fprintf((FILE *)output,"<interleave>\n");
      xmlRelaxNGDumpDefines(output,define->content);
      fprintf((FILE *)output,"</interleave>\n");
      break;
    case XML_RELAXNG_NOOP:
      xmlRelaxNGDumpDefines(output,define->content);
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGDumpDefine(FILE * output, xmlRelaxNGDefinePtr define)
{
    if (define == NULL)
        return;
    switch (define->type) {
        case XML_RELAXNG_EMPTY:
            fprintf(output, "<empty/>\n");
            break;
        case XML_RELAXNG_NOT_ALLOWED:
            fprintf(output, "<notAllowed/>\n");
            break;
        case XML_RELAXNG_TEXT:
            fprintf(output, "<text/>\n");
            break;
        case XML_RELAXNG_ELEMENT:
            fprintf(output, "<element>\n");
            if (define->name != NULL) {
                fprintf(output, "<name");
                if (define->ns != NULL)
                    fprintf(output, " ns=\"%s\"", define->ns);
                fprintf(output, ">%s</name>\n", define->name);
            }
            xmlRelaxNGDumpDefines(output, define->attrs);
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</element>\n");
            break;
        case XML_RELAXNG_LIST:
            fprintf(output, "<list>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</list>\n");
            break;
        case XML_RELAXNG_ONEORMORE:
            fprintf(output, "<oneOrMore>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</oneOrMore>\n");
            break;
        case XML_RELAXNG_ZEROORMORE:
            fprintf(output, "<zeroOrMore>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</zeroOrMore>\n");
            break;
        case XML_RELAXNG_CHOICE:
            fprintf(output, "<choice>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</choice>\n");
            break;
        case XML_RELAXNG_GROUP:
            fprintf(output, "<group>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</group>\n");
            break;
        case XML_RELAXNG_INTERLEAVE:
            fprintf(output, "<interleave>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</interleave>\n");
            break;
        case XML_RELAXNG_OPTIONAL:
            fprintf(output, "<optional>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</optional>\n");
            break;
        case XML_RELAXNG_ATTRIBUTE:
            fprintf(output, "<attribute>\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</attribute>\n");
            break;
        case XML_RELAXNG_DEF:
            fprintf(output, "<define");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</define>\n");
            break;
        case XML_RELAXNG_REF:
            fprintf(output, "<ref");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</ref>\n");
            break;
        case XML_RELAXNG_PARENTREF:
            fprintf(output, "<parentRef");
            if (define->name != NULL)
                fprintf(output, " name=\"%s\"", define->name);
            fprintf(output, ">\n");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</parentRef>\n");
            break;
        case XML_RELAXNG_EXTERNALREF:
            fprintf(output, "<externalRef>");
            xmlRelaxNGDumpDefines(output, define->content);
            fprintf(output, "</externalRef>\n");
            break;
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_VALUE:
            TODO break;
        case XML_RELAXNG_START:
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_PARAM:
            TODO break;
        case XML_RELAXNG_NOOP:
            xmlRelaxNGDumpDefines(output, define->content);
            break;
    }
}